

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O1

void Cba_ManWriteBlifLines(FILE *pFile,Cba_Ntk_t *p)

{
  long lVar1;
  Vec_Int_t *p_00;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long *plVar12;
  
  if (1 < (p->vObjType).nSize) {
    p_00 = &p->vFonName;
    lVar9 = 1;
    do {
      if ((p->vObjType).nSize <= lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar2 = (p->vObjType).pArray[lVar9];
      if (0xffffffa8 < bVar2 - 0x5a) {
        if (bVar2 == 0x49) {
          pcVar6 = Abc_NamStr(p->pDesign->pMods,0);
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar6,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar6);
          if (((p->vObjFin0).nSize <= lVar9) || (lVar1 = lVar9 + 1, (p->vObjFin0).nSize <= lVar1)) {
LAB_0034c94d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar3 = (p->vObjFin0).pArray[lVar9];
          uVar10 = (ulong)uVar3;
          iVar4 = 0;
          while ((int)uVar10 < (p->vObjFin0).pArray[lVar9 + 1]) {
            if ((int)uVar3 < 1) goto LAB_0034c994;
            if ((p->vFinFon).nSize <= (int)uVar10) goto LAB_0034c94d;
            iVar8 = (p->vFinFon).pArray[uVar10];
            pcVar6 = Mio_GateReadPinName(pGate,iVar4);
            if ((p->vFonName).nSize < 1) goto LAB_0034c975;
            if (iVar8 < 1) goto LAB_0034c96c;
            iVar8 = Vec_IntGetEntry(p_00,iVar8);
            pcVar7 = Abc_NamStr(p->pDesign->pStrs,iVar8);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
            uVar10 = uVar10 + 1;
            iVar4 = iVar4 + 1;
            if ((p->vObjFin0).nSize <= lVar1) goto LAB_0034c94d;
          }
          if ((p->vObjFon0).nSize <= lVar9) goto LAB_0034c94d;
          iVar4 = (p->vObjFon0).pArray[lVar9];
          iVar8 = (p->vObjFon0).nSize;
          iVar5 = iVar4;
          while( true ) {
            if (iVar8 <= lVar1) goto LAB_0034c94d;
            if ((p->vObjFon0).pArray[lVar9 + 1] <= iVar5) break;
            pcVar6 = Mio_GateReadOutName(pGate);
            if ((p->vFonName).nSize < 1) goto LAB_0034c975;
            if (iVar4 < 1) goto LAB_0034c96c;
            iVar8 = Vec_IntGetEntry(p_00,iVar5);
            pcVar7 = Abc_NamStr(p->pDesign->pStrs,iVar8);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
            iVar5 = iVar5 + 1;
            iVar8 = (p->vObjFon0).nSize;
          }
        }
        else {
          if (bVar2 != 3) {
            fwrite(".names",6,1,(FILE *)pFile);
            if (((p->vObjFin0).nSize <= lVar9) || ((long)(p->vObjFin0).nSize <= lVar9 + 1))
            goto LAB_0034c94d;
            uVar3 = (p->vObjFin0).pArray[lVar9];
            uVar10 = (ulong)uVar3;
            while ((int)uVar10 < (p->vObjFin0).pArray[lVar9 + 1]) {
              if ((int)uVar3 < 1) goto LAB_0034c994;
              if ((p->vFinFon).nSize <= (int)uVar10) goto LAB_0034c94d;
              if ((p->vFonName).nSize < 1) goto LAB_0034c975;
              iVar4 = (p->vFinFon).pArray[uVar10];
              if (iVar4 < 1) goto LAB_0034c96c;
              iVar4 = Vec_IntGetEntry(p_00,iVar4);
              pcVar6 = Abc_NamStr(p->pDesign->pStrs,iVar4);
              fprintf((FILE *)pFile," %s",pcVar6);
              uVar10 = uVar10 + 1;
              if ((long)(p->vObjFin0).nSize <= lVar9 + 1) goto LAB_0034c94d;
            }
            if ((p->vObjFon0).nSize <= lVar9) goto LAB_0034c94d;
            if ((p->vFonName).nSize < 1) {
LAB_0034c975:
              pcVar6 = "Cba_NtkHasFonNames(p)";
LAB_0034c97c:
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
            }
            iVar4 = (p->vObjFon0).pArray[lVar9];
            if (iVar4 < 1) {
LAB_0034c96c:
              pcVar6 = "Cba_FonIsReal(f)";
              goto LAB_0034c97c;
            }
            iVar4 = Vec_IntGetEntry(p_00,iVar4);
            pcVar6 = Abc_NamStr(p->pDesign->pStrs,iVar4);
            fprintf((FILE *)pFile," %s",pcVar6);
            if ((p->vObjFunc).nSize < 1) {
              __assert_fail("Cba_NtkHasObjFuncs(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x15c,"int Cba_ObjFunc(Cba_Ntk_t *, int)");
            }
            iVar4 = Vec_IntGetEntry(&p->vObjFunc,(int)lVar9);
            pcVar6 = Abc_NamStr(p->pDesign->pFuns,iVar4);
            fprintf((FILE *)pFile,"\n%s",pcVar6);
            goto LAB_0034c92e;
          }
          if ((p->vObjFunc).nSize < 1) {
            uVar3 = 0;
          }
          else {
            uVar3 = Vec_IntGetEntry(&p->vObjFunc,(int)lVar9);
          }
          if (((int)uVar3 < 1) || ((p->pDesign->vNtks).nSize <= (int)uVar3)) {
            plVar12 = (long *)0x0;
          }
          else {
            plVar12 = (long *)(p->pDesign->vNtks).pArray[uVar3];
          }
          fwrite(".subckt",7,1,(FILE *)pFile);
          pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(*plVar12 + 0x10),*(int *)((long)plVar12 + 0xc));
          fprintf((FILE *)pFile," %s",pcVar6);
          if (((p->vObjFin0).nSize <= lVar9) || (lVar1 = lVar9 + 1, (p->vObjFin0).nSize <= lVar1))
          goto LAB_0034c94d;
          uVar3 = (p->vObjFin0).pArray[lVar9];
          lVar11 = 0;
          while ((int)((int)lVar11 + uVar3) < (p->vObjFin0).pArray[lVar9 + 1]) {
            if ((int)uVar3 < 1) {
LAB_0034c994:
              __assert_fail("f>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
            }
            if (((p->vFinFon).nSize <= (int)((int)lVar11 + uVar3)) ||
               (*(int *)((long)plVar12 + 0x1c) <= lVar11)) goto LAB_0034c94d;
            iVar4 = *(int *)(plVar12[4] + lVar11 * 4);
            if (iVar4 < 1) goto LAB_0034c9d2;
            if (*(int *)((long)plVar12 + 0xcc) < 1) goto LAB_0034c9b3;
            iVar8 = (p->vFinFon).pArray[(ulong)uVar3 + lVar11];
            iVar4 = Vec_IntGetEntry((Vec_Int_t *)(plVar12 + 0x19),iVar4);
            pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(*plVar12 + 0x10),iVar4);
            if ((p->vFonName).nSize < 1) goto LAB_0034c975;
            if (iVar8 < 1) goto LAB_0034c96c;
            iVar4 = Vec_IntGetEntry(p_00,iVar8);
            pcVar7 = Abc_NamStr(p->pDesign->pStrs,iVar4);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
            lVar11 = lVar11 + 1;
            if ((p->vObjFin0).nSize <= lVar1) goto LAB_0034c94d;
          }
          if (((p->vObjFon0).nSize <= lVar9) || ((p->vObjFon0).nSize <= lVar1)) goto LAB_0034c94d;
          iVar4 = (p->vObjFon0).pArray[lVar9];
          lVar11 = 0;
          while (iVar8 = iVar4 + (int)lVar11, iVar8 < (p->vObjFon0).pArray[lVar9 + 1]) {
            if (*(int *)((long)plVar12 + 0x2c) <= lVar11) goto LAB_0034c94d;
            iVar5 = *(int *)(plVar12[6] + lVar11 * 4);
            if (iVar5 < 1) {
LAB_0034c9d2:
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x15e,"char *Cba_ObjNameStr(Cba_Ntk_t *, int)");
            }
            if (*(int *)((long)plVar12 + 0xcc) < 1) {
LAB_0034c9b3:
              __assert_fail("Cba_NtkHasObjNames(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x15d,"int Cba_ObjName(Cba_Ntk_t *, int)");
            }
            iVar5 = Vec_IntGetEntry((Vec_Int_t *)(plVar12 + 0x19),iVar5);
            pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(*plVar12 + 0x10),iVar5);
            if ((p->vFonName).nSize < 1) goto LAB_0034c975;
            if (iVar4 < 1) goto LAB_0034c96c;
            iVar8 = Vec_IntGetEntry(p_00,iVar8);
            pcVar7 = Abc_NamStr(p->pDesign->pStrs,iVar8);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
            lVar11 = lVar11 + 1;
            if ((p->vObjFon0).nSize <= lVar1) goto LAB_0034c94d;
          }
        }
        fputc(10,(FILE *)pFile);
      }
LAB_0034c92e:
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vObjType).nSize);
  }
  return;
}

Assistant:

void Cba_ManWriteBlifLines( FILE * pFile, Cba_Ntk_t * p )
{
    int k, iObj, iFin, iFon;
    Cba_NtkForEachBox( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_Ntk_t * pNtk = Cba_ObjNtk( p, iObj );
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Cba_NtkName(pNtk) );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPi(pNtk, k)), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPo(pNtk, k)), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else if ( Cba_ObjIsGate(p, iObj) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Cba_ObjNtkId( p, iObj ));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s", Cba_FonNameStr(p, iFon) );
            fprintf( pFile, " %s", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)) );
            fprintf( pFile, "\n%s",  Cba_NtkSop(p, Cba_ObjFunc(p, iObj)) );
        }
    }
}